

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O2

void __thiscall
Diligent::DeviceContextVkImpl::CommitShaderResources
          (DeviceContextVkImpl *this,IShaderResourceBinding *pShaderResourceBinding,
          RESOURCE_STATE_TRANSITION_MODE StateTransitionMode)

{
  byte bVar1;
  PipelineResourceSignatureVkImpl *this_00;
  VkDescriptorSetLayout SetLayout;
  char *pcVar2;
  Uint32 UVar3;
  ShaderResourceBindingVkImpl *pSRB;
  ResourceBindInfo *this_01;
  DescriptorSet *pDVar4;
  VkDescriptorSet pVVar5;
  char (*pacVar6) [114];
  char *Args_1;
  char *pcVar7;
  uint Index;
  ShaderResourceCacheImplType *this_02;
  allocator local_59;
  string msg;
  
  DeviceContextBase<Diligent::EngineVkImplTraits>::CommitShaderResources
            ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,pShaderResourceBinding,
             StateTransitionMode,0);
  pSRB = ClassPtrCast<Diligent::ShaderResourceBindingVkImpl,Diligent::IShaderResourceBinding>
                   (pShaderResourceBinding);
  if ((pSRB->super_ShaderResourceBindingBase<Diligent::EngineVkImplTraits>).m_ShaderResourceCache.
      m_NumSets != 0) {
    this_02 = &(pSRB->super_ShaderResourceBindingBase<Diligent::EngineVkImplTraits>).
               m_ShaderResourceCache;
    ShaderResourceCacheVk::DbgVerifyDynamicBuffersCounter(this_02);
    if (StateTransitionMode == RESOURCE_STATE_TRANSITION_MODE_VERIFY) {
      ShaderResourceCacheVk::TransitionResources<true>(this_02,this);
    }
    else if (StateTransitionMode == RESOURCE_STATE_TRANSITION_MODE_TRANSITION) {
      ShaderResourceCacheVk::TransitionResources<false>(this_02,this);
    }
    this_00 = (pSRB->super_ShaderResourceBindingBase<Diligent::EngineVkImplTraits>).m_pPRS.m_pObject
    ;
    bVar1 = (this_00->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).
            super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
            .m_Desc.BindingIndex;
    this_01 = GetBindInfo(this,(this_00->
                               super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).
                               m_PipelineType);
    pacVar6 = (char (*) [114])((ulong)bVar1 * 0x20);
    pcVar7 = pacVar6[2] + 4 + (long)&this_01->super_CommittedShaderResources;
    Args_1 = (char *)pacVar6;
    DeviceContextBase<Diligent::EngineVkImplTraits>::CommittedShaderResources::Set
              (&this_01->super_CommittedShaderResources,(uint)bVar1,pSRB);
    pcVar7[0] = '\0';
    pcVar7[1] = '\0';
    pcVar7[2] = '\0';
    pcVar7[3] = '\0';
    pcVar7[4] = '\0';
    pcVar7[5] = '\0';
    pcVar7[6] = '\0';
    pcVar7[7] = '\0';
    pcVar2 = pacVar6[2] + 0xc + (long)&this_01->super_CommittedShaderResources;
    pcVar2[0] = '\0';
    pcVar2[1] = '\0';
    pcVar2[2] = '\0';
    pcVar2[3] = '\0';
    pcVar2[4] = '\0';
    pcVar2[5] = '\0';
    pcVar2[6] = '\0';
    pcVar2[7] = '\0';
    if ((this_00->m_VkDescrSetLayouts)._M_elems[0].m_VkObject == (VkDescriptorSetLayout_T *)0x0) {
      Index = 0;
    }
    else {
      UVar3 = PipelineResourceSignatureVkImpl::
              GetDescriptorSetIndex<(Diligent::PipelineResourceSignatureVkImpl::DESCRIPTOR_SET_ID)0>
                        (this_00);
      if (UVar3 != 0) {
        FormatString<char[26],char[114]>
                  (&msg,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])
                   "DSIndex == pSignature->GetDescriptorSetIndex<PipelineResourceSignatureVkImpl::DESCRIPTOR_SET_ID_STATIC_MUTABLE>()"
                   ,(char (*) [114])Args_1);
        Args_1 = (char *)0x23d;
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"CommitShaderResources",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0x23d);
        std::__cxx11::string::~string((string *)&msg);
      }
      pDVar4 = ShaderResourceCacheVk::GetDescriptorSet(this_02,0);
      pVVar5 = (pDVar4->m_DescriptorSetAllocation).Set;
      if (pVVar5 == (VkDescriptorSet)0x0) {
        FormatString<char[26],char[54]>
                  (&msg,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"CachedDescrSet.GetVkDescriptorSet() != VK_NULL_HANDLE",
                   (char (*) [54])Args_1);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"CommitShaderResources",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0x23f);
        std::__cxx11::string::~string((string *)&msg);
        pVVar5 = (pDVar4->m_DescriptorSetAllocation).Set;
      }
      *(VkDescriptorSet *)pcVar7 = pVVar5;
      Index = 1;
      Args_1 = pcVar7;
    }
    if ((this_00->m_VkDescrSetLayouts)._M_elems[1].m_VkObject != (VkDescriptorSetLayout_T *)0x0) {
      UVar3 = PipelineResourceSignatureVkImpl::
              GetDescriptorSetIndex<(Diligent::PipelineResourceSignatureVkImpl::DESCRIPTOR_SET_ID)1>
                        (this_00);
      if (Index != UVar3) {
        FormatString<char[26],char[107]>
                  (&msg,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])
                   "DSIndex == pSignature->GetDescriptorSetIndex<PipelineResourceSignatureVkImpl::DESCRIPTOR_SET_ID_DYNAMIC>()"
                   ,(char (*) [107])Args_1);
        Args_1 = (char *)0x246;
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"CommitShaderResources",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0x246);
        std::__cxx11::string::~string((string *)&msg);
      }
      pDVar4 = ShaderResourceCacheVk::GetDescriptorSet(this_02,Index);
      if ((pDVar4->m_DescriptorSetAllocation).Set != (VkDescriptorSet)0x0) {
        FormatString<char[26],char[121]>
                  (&msg,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])
                   "const_cast<const ShaderResourceCacheVk&>(ResourceCache).GetDescriptorSet(DSIndex).GetVkDescriptorSet() == VK_NULL_HANDLE"
                   ,(char (*) [121])Args_1);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"CommitShaderResources",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0x247);
        std::__cxx11::string::~string((string *)&msg);
      }
      SetLayout = (this_00->m_VkDescrSetLayouts)._M_elems[1].m_VkObject;
      std::__cxx11::string::string((string *)&msg,"Dynamic Descriptor Set",&local_59);
      std::__cxx11::string::append((char *)&msg);
      std::__cxx11::string::append((char *)&msg);
      std::__cxx11::string::push_back((char)&msg);
      pVVar5 = DynamicDescriptorSetAllocator::Allocate
                         (&this->m_DynamicDescrSetAllocator,SetLayout,msg._M_dataplus._M_p);
      PipelineResourceSignatureVkImpl::CommitDynamicResources(this_00,this_02,pVVar5);
      *(VkDescriptorSet *)(pcVar7 + (ulong)Index * 8) = pVVar5;
      Index = Index + 1;
      std::__cxx11::string::~string((string *)&msg);
      Args_1 = pcVar7;
    }
    if (Index != (pSRB->super_ShaderResourceBindingBase<Diligent::EngineVkImplTraits>).
                 m_ShaderResourceCache.m_NumSets) {
      FormatString<char[26],char[48]>
                (&msg,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"DSIndex == ResourceCache.GetNumDescriptorSets()",
                 (char (*) [48])Args_1);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"CommitShaderResources",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                 ,0x25e);
      std::__cxx11::string::~string((string *)&msg);
    }
  }
  return;
}

Assistant:

void DeviceContextVkImpl::CommitShaderResources(IShaderResourceBinding* pShaderResourceBinding, RESOURCE_STATE_TRANSITION_MODE StateTransitionMode)
{
    TDeviceContextBase::CommitShaderResources(pShaderResourceBinding, StateTransitionMode, 0 /*Dummy*/);

    ShaderResourceBindingVkImpl* pResBindingVkImpl = ClassPtrCast<ShaderResourceBindingVkImpl>(pShaderResourceBinding);
    ShaderResourceCacheVk&       ResourceCache     = pResBindingVkImpl->GetResourceCache();
    if (ResourceCache.GetNumDescriptorSets() == 0)
    {
        // Ignore SRBs that contain no resources
        return;
    }

#ifdef DILIGENT_DEBUG
    ResourceCache.DbgVerifyDynamicBuffersCounter();
#endif

    if (StateTransitionMode == RESOURCE_STATE_TRANSITION_MODE_TRANSITION)
    {
        ResourceCache.TransitionResources<false>(this);
    }
#ifdef DILIGENT_DEVELOPMENT
    else if (StateTransitionMode == RESOURCE_STATE_TRANSITION_MODE_VERIFY)
    {
        ResourceCache.TransitionResources<true>(this);
    }
#endif

    const Uint32                           SRBIndex   = pResBindingVkImpl->GetBindingIndex();
    const PipelineResourceSignatureVkImpl* pSignature = pResBindingVkImpl->GetSignature();
    ResourceBindInfo&                      BindInfo   = GetBindInfo(pResBindingVkImpl->GetPipelineType());
    ResourceBindInfo::DescriptorSetInfo&   SetInfo    = BindInfo.SetInfo[SRBIndex];

    BindInfo.Set(SRBIndex, pResBindingVkImpl);
    // We must not clear entire ResInfo as DescriptorSetBaseInd and DynamicOffsetCount
    // are set by SetPipelineState().
    SetInfo.vkSets = {};

    Uint32 DSIndex = 0;
    if (pSignature->HasDescriptorSet(PipelineResourceSignatureVkImpl::DESCRIPTOR_SET_ID_STATIC_MUTABLE))
    {
        VERIFY_EXPR(DSIndex == pSignature->GetDescriptorSetIndex<PipelineResourceSignatureVkImpl::DESCRIPTOR_SET_ID_STATIC_MUTABLE>());
        const ShaderResourceCacheVk::DescriptorSet& CachedDescrSet = const_cast<const ShaderResourceCacheVk&>(ResourceCache).GetDescriptorSet(DSIndex);
        VERIFY_EXPR(CachedDescrSet.GetVkDescriptorSet() != VK_NULL_HANDLE);
        SetInfo.vkSets[DSIndex] = CachedDescrSet.GetVkDescriptorSet();
        ++DSIndex;
    }

    if (pSignature->HasDescriptorSet(PipelineResourceSignatureVkImpl::DESCRIPTOR_SET_ID_DYNAMIC))
    {
        VERIFY_EXPR(DSIndex == pSignature->GetDescriptorSetIndex<PipelineResourceSignatureVkImpl::DESCRIPTOR_SET_ID_DYNAMIC>());
        VERIFY_EXPR(const_cast<const ShaderResourceCacheVk&>(ResourceCache).GetDescriptorSet(DSIndex).GetVkDescriptorSet() == VK_NULL_HANDLE);

        const VkDescriptorSetLayout vkLayout = pSignature->GetVkDescriptorSetLayout(PipelineResourceSignatureVkImpl::DESCRIPTOR_SET_ID_DYNAMIC);

        VkDescriptorSet vkDynamicDescrSet   = VK_NULL_HANDLE;
        const char*     DynamicDescrSetName = "Dynamic Descriptor Set";
#ifdef DILIGENT_DEVELOPMENT
        String _DynamicDescrSetName{DynamicDescrSetName};
        _DynamicDescrSetName.append(" (");
        _DynamicDescrSetName.append(pSignature->GetDesc().Name);
        _DynamicDescrSetName += ')';
        DynamicDescrSetName = _DynamicDescrSetName.c_str();
#endif
        // Allocate vulkan descriptor set for dynamic resources
        vkDynamicDescrSet = AllocateDynamicDescriptorSet(vkLayout, DynamicDescrSetName);

        // Write all dynamic resource descriptors
        pSignature->CommitDynamicResources(ResourceCache, vkDynamicDescrSet);

        SetInfo.vkSets[DSIndex] = vkDynamicDescrSet;
        ++DSIndex;
    }

    VERIFY_EXPR(DSIndex == ResourceCache.GetNumDescriptorSets());
}